

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::receiveCap
          (RpcConnectionState *this,Reader descriptor,ArrayPtr<kj::OwnFd> fds)

{
  _func_int **pp_Var1;
  _func_int *p_Var2;
  long *plVar3;
  Reader ops_00;
  String *pSVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint *puVar8;
  SegmentReader *pSVar9;
  Refcounted *refcounted;
  ClientHook *pCVar10;
  ClientHook *pCVar11;
  RpcClient *pRVar12;
  RpcConnectionState *pRVar13;
  RpcConnectionState *pRVar14;
  undefined2 uVar15;
  ulong in_RCX;
  size_t sVar16;
  uint *puVar17;
  DeferredThirdPartyClient *extraout_RDX;
  DeferredThirdPartyClient *extraout_RDX_00;
  DeferredThirdPartyClient *extraout_RDX_01;
  DeferredThirdPartyClient *extraout_RDX_02;
  DeferredThirdPartyClient *extraout_RDX_03;
  DeferredThirdPartyClient *extraout_RDX_04;
  DeferredThirdPartyClient *extraout_RDX_05;
  DeferredThirdPartyClient *extraout_RDX_06;
  DeferredThirdPartyClient *extraout_RDX_07;
  DeferredThirdPartyClient *extraout_RDX_08;
  DeferredThirdPartyClient *extraout_RDX_09;
  DeferredThirdPartyClient *extraout_RDX_10;
  DeferredThirdPartyClient *extraout_RDX_11;
  DeferredThirdPartyClient *extraout_RDX_12;
  DeferredThirdPartyClient *extraout_RDX_13;
  DeferredThirdPartyClient *extraout_RDX_14;
  undefined1 uVar18;
  ImportId importId;
  long lVar19;
  ulong uVar20;
  RpcClient *result_1;
  bool bVar21;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t> OVar22;
  Own<capnp::ClientHook,_std::nullptr_t> OVar23;
  Own<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,_std::nullptr_t> OVar24;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar25;
  StringPtr reason;
  StringPtr reason_00;
  Maybe<kj::OwnFd> fd;
  Array<capnp::PipelineOp> ops;
  Own<capnp::ClientHook,_std::nullptr_t> result;
  Reader promisedAnswer;
  Maybe<kj::OwnFd> local_110;
  undefined1 local_108 [32];
  undefined1 local_e8 [24];
  anon_union_16_1_a8a2e026_for_OneOf<kj::Promise<void>,_capnp::_::RpcSystemBase::RpcConnectionState::Answer::Finished,_kj::Promise<kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcResponse,_std::nullptr_t>_>,_kj::Rc<capnp::_::RpcSystemBase::RpcConnectionState::ThirdPartyExchangeValue>_>_2
  local_d0;
  undefined1 local_c0 [48];
  undefined1 local_90 [16];
  Maybe<kj::OwnFd> local_80;
  Maybe<kj::OwnFd> local_78;
  Maybe<kj::OwnFd> local_70;
  Own<capnp::AnyPointer::Reader,_std::nullptr_t> local_68;
  undefined1 local_58 [48];
  
  sVar16 = fds.size_;
  pRVar14 = (RpcConnectionState *)fds.ptr;
  uVar20 = 0xff;
  if (0x17 < descriptor._reader.dataSize) {
    uVar20 = (ulong)*(byte *)((long)descriptor._reader.data + 2) ^ 0xff;
  }
  local_110.ptr.isSet = false;
  if ((uVar20 < in_RCX) && (-1 < *(int *)(sVar16 + uVar20 * 4))) {
    local_110.ptr.field_1 =
         *(anon_union_4_1_a8c68091_for_NullableValue<kj::OwnFd>_2 *)(sVar16 + uVar20 * 4);
    *(undefined4 *)(sVar16 + uVar20 * 4) = 0xffffffff;
    local_110.ptr.isSet = true;
  }
  if (descriptor._reader.dataSize < 0x10) {
    uVar15 = 0;
  }
  else {
    uVar15 = *descriptor._reader.data;
  }
  puVar17 = &switchD_003499b9::switchdataD_0058142c;
  importId = (ImportId)fds.ptr;
  switch(uVar15) {
  case 0:
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)0x0;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    break;
  case 1:
    uVar18 = false;
    if (0x3f < descriptor._reader.dataSize) {
      uVar18 = (undefined1)*(undefined4 *)((long)descriptor._reader.data + 4);
    }
    kj::Maybe<kj::OwnFd>::Maybe(&local_70,&local_110);
    OVar22 = import((RpcConnectionState *)local_c0,importId,(bool)uVar18,(Maybe<kj::OwnFd> *)0x0);
    puVar17 = (uint *)OVar22.ptr;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_c0._0_8_;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_c0._8_8_;
    local_c0._8_8_ = (ClientHook *)0x0;
    if (local_70.ptr.isSet == true) {
      kj::OwnFd::~OwnFd(&local_70.ptr.field_1.value);
      puVar17 = (uint *)extraout_RDX_07;
    }
    break;
  case 2:
    uVar18 = false;
    if (0x3f < descriptor._reader.dataSize) {
      uVar18 = (undefined1)*(undefined4 *)((long)descriptor._reader.data + 4);
    }
    kj::Maybe<kj::OwnFd>::Maybe(&local_78,&local_110);
    OVar22 = import((RpcConnectionState *)local_c0,importId,(bool)uVar18,(Maybe<kj::OwnFd> *)0x1);
    puVar17 = (uint *)OVar22.ptr;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_c0._0_8_;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_c0._8_8_;
    local_c0._8_8_ = (ClientHook *)0x0;
    if (local_78.ptr.isSet == true) {
      kj::OwnFd::~OwnFd(&local_78.ptr.field_1.value);
      puVar17 = (uint *)extraout_RDX;
    }
    break;
  case 3:
    anon_unknown_18::ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>
    ::find((ExportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export> *)
           local_c0,importId + 0x1b8);
    uVar5 = local_c0._0_8_;
    if ((SegmentReader *)local_c0._0_8_ == (SegmentReader *)0x0) {
      reason_00.content.size_ = (size_t)"invalid \'receiverHosted\' export ID";
      reason_00.content.ptr = local_c0;
      OVar23 = newBrokenCap(reason_00);
      puVar17 = (uint *)OVar23.ptr;
      pSVar9 = (SegmentReader *)local_c0._0_8_;
      pCVar11 = (ClientHook *)local_c0._8_8_;
    }
    else {
      (**(code **)(*((ClientHook *)(local_c0._0_8_ + 0x10))->_vptr_ClientHook + 0x20))(local_c0);
      puVar17 = (uint *)extraout_RDX_00;
      if (((ClientHook *)(uVar5 + 0x30))->_vptr_ClientHook != (_func_int **)0x0) {
        pp_Var1 = ((ClientHook *)(uVar5 + 0x30))->_vptr_ClientHook;
        puVar17 = (uint *)(pp_Var1 + 1);
        if (*(int *)pp_Var1 == 2) {
          bVar21 = *(RpcSystemBrand **)(local_c0._8_8_ + 8) == (pRVar14->brand).ptr;
          local_108[0] = bVar21;
          if (!bVar21) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
                      ((Fault *)local_e8,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
                       ,0x855,FAILED,"isSameNetwork(*result)","_kjCondition,",
                       (DebugExpression<bool> *)local_108);
            kj::_::Debug::Fault::fatal((Fault *)local_e8);
          }
          local_e8._0_8_ = (Exception *)0x0;
          local_e8._8_8_ = (RpcClient *)0x0;
          if ((ClientHook *)local_c0._8_8_ != (ClientHook *)0x0) {
            local_e8._8_8_ = local_c0._8_8_;
            local_e8._0_8_ = local_c0._0_8_;
            local_c0._8_8_ = (ClientHook *)0x0;
          }
          pRVar13 = *(RpcConnectionState **)(local_e8._8_8_ + 0x28);
          clone<capnp::AnyPointer::Reader&,capnp::AnyPointer>
                    ((capnp *)local_90,(Reader *)pp_Var1[2]);
          OVar24 = kj::
                   refcounted<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
                             ((kj *)local_108,pRVar13,
                              (Own<capnp::AnyPointer::Reader,_std::nullptr_t> *)local_90,
                              (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>
                               *)local_e8);
          uVar6 = local_c0._0_8_;
          uVar5 = local_108._8_8_;
          puVar17 = (uint *)OVar24.ptr;
          local_108._8_8_ = (ClientHook *)0x0;
          pSVar9 = (SegmentReader *)local_108._0_8_;
          pCVar11 = (ClientHook *)uVar5;
          if ((ClientHook *)local_c0._8_8_ != (ClientHook *)0x0) {
            lVar19 = local_c0._8_8_ + *(long *)(*(_func_int **)local_c0._8_8_ + -0x10);
            p_Var2 = *(_func_int **)local_c0._0_8_;
            local_c0._0_8_ = (SegmentReader *)local_108._0_8_;
            local_c0._8_8_ = (ClientHook *)uVar5;
            (**(code **)p_Var2)(uVar6,lVar19);
            puVar17 = (uint *)extraout_RDX_01;
            pSVar9 = (SegmentReader *)local_c0._0_8_;
            pCVar11 = (ClientHook *)local_c0._8_8_;
          }
          local_c0._8_8_ = pCVar11;
          local_c0._0_8_ = pSVar9;
          uVar5 = local_108._8_8_;
          if ((ClientHook *)local_108._8_8_ != (ClientHook *)0x0) {
            local_108._8_8_ = (ClientHook *)0x0;
            (**(code **)*(_func_int **)local_108._0_8_)
                      (local_108._0_8_,uVar5 + *(long *)(*(_func_int **)uVar5 + -0x10));
            puVar17 = (uint *)extraout_RDX_02;
          }
          if ((_func_int **)local_90._8_8_ != (_func_int **)0x0) {
            local_90._8_8_ = (_func_int **)0x0;
            (**(code **)*(_func_int **)local_90._0_8_)();
            puVar17 = (uint *)extraout_RDX_03;
          }
          if ((RpcClient *)local_e8._8_8_ != (RpcClient *)0x0) {
            local_e8._8_8_ = (RpcClient *)0x0;
            (*(code *)((Arena *)(((String *)local_e8._0_8_)->content).ptr)->_vptr_Arena)();
            puVar17 = (uint *)extraout_RDX_04;
          }
        }
      }
      uVar5 = local_c0._8_8_;
      if ((*(RpcSystemBrand **)(local_c0._8_8_ + 8) != (pRVar14->brand).ptr) ||
         (pCVar10 = (ClientHook *)local_c0._8_8_,
         *(RpcConnectionState **)(local_c0._8_8_ + 0x28) != pRVar14)) {
        pCVar10 = (ClientHook *)0x0;
      }
      pSVar9 = (SegmentReader *)local_c0._0_8_;
      pCVar11 = (ClientHook *)local_c0._8_8_;
      if (pCVar10 != (ClientHook *)0x0) {
        pCVar11 = (ClientHook *)operator_new(0x30);
        uVar6 = local_c0._0_8_;
        local_c0._8_8_ = (_func_int **)0x0;
        ClientHook::ClientHook(pCVar11,(void *)0x0);
        uVar7 = local_c0._0_8_;
        pCVar11->_vptr_ClientHook = (_func_int **)&PTR_newCall_006faee8;
        pCVar11[1]._vptr_ClientHook = (_func_int **)&DAT_006faf38;
        pCVar11[2]._vptr_ClientHook = (_func_int **)uVar6;
        pCVar11[2].brand = (void *)uVar5;
        *(undefined4 *)&pCVar11[1].brand = 1;
        puVar17 = (uint *)extraout_RDX_05;
        pSVar9 = (SegmentReader *)(pCVar11 + 1);
        if ((_func_int **)local_c0._8_8_ != (_func_int **)0x0) {
          lVar19 = local_c0._8_8_ + *(long *)(*(_func_int **)local_c0._8_8_ + -0x10);
          p_Var2 = *(_func_int **)local_c0._0_8_;
          local_c0._0_8_ = (SegmentReader *)(pCVar11 + 1);
          local_c0._8_8_ = pCVar11;
          (**(code **)p_Var2)(uVar7,lVar19);
          puVar17 = (uint *)extraout_RDX_06;
          pSVar9 = (SegmentReader *)local_c0._0_8_;
          pCVar11 = (ClientHook *)local_c0._8_8_;
        }
      }
    }
    local_c0._8_8_ = pCVar11;
    local_c0._0_8_ = pSVar9;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_c0._0_8_;
    pRVar12 = (RpcClient *)local_c0._8_8_;
    goto LAB_00349ef1;
  case 4:
    if (descriptor._reader.pointerCount == 0) {
      descriptor._reader.nestingLimit = 0x7fffffff;
      descriptor._reader.capTable = (CapTableReader *)0x0;
      descriptor._reader.pointers = (WirePointer *)0x0;
      descriptor._reader.segment = (SegmentReader *)0x0;
    }
    local_e8._0_8_ = descriptor._reader.segment;
    local_e8._8_8_ = descriptor._reader.capTable;
    local_e8._16_8_ = descriptor._reader.pointers;
    local_d0._0_4_ = descriptor._reader.nestingLimit;
    PointerReader::getStruct((StructReader *)local_c0,(PointerReader *)local_e8,(word *)0x0);
    anon_unknown_18::ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>
    ::find((ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *)
           local_e8,importId + 0x2d8);
    uVar5 = local_e8._0_8_;
    if (((Exception *)local_e8._0_8_ != (Exception *)0x0) &&
       (*(void **)&(((String *)local_e8._0_8_)->content).size_ != (void *)0x0)) {
      local_e8._8_8_ = local_c0._8_8_;
      local_e8._0_8_ = local_c0._0_8_;
      if (local_c0._36_2_ == 0) {
        local_c0._40_4_ = 0x7fffffff;
        local_c0._24_8_ = (WirePointer *)0x0;
        local_e8._8_8_ = (RpcConnectionState *)0x0;
        local_e8._0_8_ = (Exception *)0x0;
      }
      local_e8._16_8_ = local_c0._24_8_;
      local_d0._0_4_ = local_c0._40_4_;
      PointerReader::getList
                ((ListReader *)local_58,(PointerReader *)local_e8,INLINE_COMPOSITE,(word *)0x0);
      ops_00.reader.capTable = (CapTableReader *)local_58._8_8_;
      ops_00.reader.segment = (SegmentReader *)local_58._0_8_;
      ops_00.reader.ptr = (byte *)local_58._16_8_;
      ops_00.reader.elementCount = local_58._24_4_;
      ops_00.reader.step = local_58._28_4_;
      ops_00.reader.structDataSize = local_58._32_4_;
      ops_00.reader.structPointerCount = local_58._36_2_;
      ops_00.reader.elementSize = local_58[0x26];
      ops_00.reader._39_1_ = local_58[0x27];
      ops_00.reader._40_8_ = local_58._40_8_;
      anon_unknown_18::toPipelineOps(ops_00);
      plVar3 = *(long **)&(((String *)uVar5)->content).size_;
      (**(code **)(*plVar3 + 8))(local_e8,plVar3,local_108._0_8_,local_108._8_8_);
      uVar5 = local_e8._8_8_;
      if (((RpcSystemBrand *)(((Refcounted *)(local_e8._8_8_ + 8))->super_Disposer)._vptr_Disposer
           != (pRVar14->brand).ptr) ||
         (pRVar13 = (RpcConnectionState *)local_e8._8_8_,
         *(RpcConnectionState **)(local_e8._8_8_ + 0x28) != pRVar14)) {
        pRVar13 = (RpcConnectionState *)0x0;
      }
      puVar17 = (uint *)extraout_RDX_10;
      puVar8 = (uint *)local_e8._0_8_;
      pRVar14 = (RpcConnectionState *)local_e8._8_8_;
      if (pRVar13 != (RpcConnectionState *)0x0) {
        pRVar14 = (RpcConnectionState *)operator_new(0x30);
        uVar6 = local_e8._0_8_;
        local_e8._8_8_ = (RpcClient *)0x0;
        ClientHook::ClientHook((ClientHook *)pRVar14,(void *)0x0);
        uVar7 = local_e8._0_8_;
        puVar8 = &(pRVar14->super_Refcounted).refcount;
        ((ClientHook *)&pRVar14->super_ErrorHandler)->_vptr_ClientHook =
             (_func_int **)&PTR_newCall_006faee8;
        *(undefined **)&(pRVar14->super_Refcounted).refcount = &DAT_006faf38;
        *(undefined8 *)&(pRVar14->connection).tag = uVar6;
        *(undefined8 *)&(pRVar14->connection).field_1 = uVar5;
        *(uint *)&pRVar14->bootstrapFactory = 1;
        puVar17 = (uint *)extraout_RDX_11;
        if ((RpcClient *)local_e8._8_8_ != (RpcClient *)0x0) {
          lVar19 = *(long *)(*(long *)local_e8._8_8_ + -0x10) + local_e8._8_8_;
          pSVar4 = (String *)local_e8._0_8_;
          local_e8._0_8_ = puVar8;
          local_e8._8_8_ = pRVar14;
          (*(code *)((Arena *)(pSVar4->content).ptr)->_vptr_Arena)(uVar7,lVar19);
          puVar17 = (uint *)extraout_RDX_12;
          puVar8 = (uint *)local_e8._0_8_;
          pRVar14 = (RpcConnectionState *)local_e8._8_8_;
        }
      }
      local_e8._8_8_ = pRVar14;
      local_e8._0_8_ = puVar8;
      uVar6 = local_108._8_8_;
      uVar5 = local_108._0_8_;
      (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_e8._0_8_;
      (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_e8._8_8_;
      if ((SegmentReader *)local_108._0_8_ != (SegmentReader *)0x0) {
        local_108._0_8_ = (SegmentReader *)0x0;
        local_108._8_8_ = (ClientHook *)0x0;
        (*(code *)**(undefined8 **)local_108._16_8_)(local_108._16_8_,uVar5,8,uVar6,uVar6,0);
        puVar17 = (uint *)extraout_RDX_13;
      }
      break;
    }
    reason.content.size_ = (size_t)"invalid \'receiverAnswer\'";
    reason.content.ptr = local_e8;
    OVar23 = newBrokenCap(reason);
    puVar17 = (uint *)OVar23.ptr;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_e8._0_8_;
    pRVar12 = (RpcClient *)local_e8._8_8_;
LAB_00349ef1:
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)pRVar12;
    break;
  case 5:
    if (descriptor._reader.pointerCount == 0) {
      descriptor._reader.nestingLimit = 0x7fffffff;
      descriptor._reader.capTable = (CapTableReader *)0x0;
      descriptor._reader.pointers = (WirePointer *)0x0;
      descriptor._reader.segment = (SegmentReader *)0x0;
    }
    uVar18 = false;
    local_e8._0_8_ = descriptor._reader.segment;
    local_e8._8_8_ = descriptor._reader.capTable;
    local_e8._16_8_ = descriptor._reader.pointers;
    local_d0._0_4_ = descriptor._reader.nestingLimit;
    PointerReader::getStruct((StructReader *)local_c0,(PointerReader *)local_e8,(word *)0x0);
    if (0x1f < (uint)local_c0._32_4_) {
      uVar18 = (undefined1)*(undefined4 *)local_c0._16_8_;
    }
    kj::Maybe<kj::OwnFd>::Maybe(&local_80,&local_110);
    import((RpcConnectionState *)local_108,importId,(bool)uVar18,(Maybe<kj::OwnFd> *)0x0);
    if (local_80.ptr.isSet == true) {
      kj::OwnFd::~OwnFd(&local_80.ptr.field_1.value);
    }
    local_e8._8_8_ = local_c0._8_8_;
    local_e8._0_8_ = local_c0._0_8_;
    if (local_c0._36_2_ == 0) {
      local_c0._40_4_ = 0x7fffffff;
      local_c0._24_8_ = (WirePointer *)0x0;
      local_e8._8_8_ = (RpcClient *)0x0;
      local_e8._0_8_ = (Exception *)0x0;
    }
    local_e8._16_8_ = local_c0._24_8_;
    local_d0._0_4_ = local_c0._40_4_;
    clone<capnp::AnyPointer::Reader,capnp::AnyPointer>((capnp *)&local_68,(Reader *)local_e8);
    OVar24 = kj::
             refcounted<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient,capnp::_::RpcSystemBase::RpcConnectionState&,kj::Own<capnp::AnyPointer::Reader,decltype(nullptr)>,kj::Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,decltype(nullptr)>>
                       ((kj *)local_90,pRVar14,&local_68,
                        (Own<capnp::_::RpcSystemBase::RpcConnectionState::RpcClient,_std::nullptr_t>
                         *)local_108);
    puVar17 = (uint *)OVar24.ptr;
    (this->super_ErrorHandler)._vptr_ErrorHandler = (_func_int **)local_90._0_8_;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_90._8_8_;
    local_90._8_8_ = (_func_int **)0x0;
    if (local_68.ptr != (Reader *)0x0) {
      local_68.ptr = (Reader *)0x0;
      (*(code *)*(local_68.disposer)->_vptr_Disposer)();
      puVar17 = (uint *)extraout_RDX_08;
    }
    uVar5 = local_108._8_8_;
    if ((ClientHook *)local_108._8_8_ != (ClientHook *)0x0) {
      local_108._8_8_ = (ClientHook *)0x0;
      (**(code **)*(_func_int **)local_108._0_8_)
                (local_108._0_8_,uVar5 + *(long *)(*(_func_int **)uVar5 + -0x10));
      puVar17 = (uint *)extraout_RDX_09;
    }
    break;
  default:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[27]>
              ((Fault *)local_c0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/rpc.c++"
               ,0x882,FAILED,(char *)0x0,"\"unknown CapDescriptor type\"",
               (char (*) [27])"unknown CapDescriptor type");
    kj::_::Debug::Fault::fatal((Fault *)local_c0);
  }
  if (local_110.ptr.isSet == true) {
    kj::OwnFd::~OwnFd(&local_110.ptr.field_1.value);
    puVar17 = (uint *)extraout_RDX_14;
  }
  MVar25.ptr.ptr = (ClientHook *)puVar17;
  MVar25.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar25.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> receiveCap(rpc::CapDescriptor::Reader descriptor,
                                            kj::ArrayPtr<kj::OwnFd> fds) {
    uint fdIndex = descriptor.getAttachedFd();
    kj::Maybe<kj::OwnFd> fd;
    if (fdIndex < fds.size() && fds[fdIndex] != nullptr) {
      fd = kj::mv(fds[fdIndex]);
    }

    switch (descriptor.which()) {
      case rpc::CapDescriptor::NONE:
        return kj::none;

      case rpc::CapDescriptor::SENDER_HOSTED:
        return import(descriptor.getSenderHosted(), false, kj::mv(fd));
      case rpc::CapDescriptor::SENDER_PROMISE:
        return import(descriptor.getSenderPromise(), true, kj::mv(fd));

      case rpc::CapDescriptor::RECEIVER_HOSTED:
        KJ_IF_SOME(exp, exports.find(descriptor.getReceiverHosted())) {
          auto result = exp.clientHook->addRef();
          KJ_IF_SOME(vineInfo, exp.vineInfo) {
            KJ_IF_SOME(contact, vineInfo->info.tryGet<VineInfo::Contact>()) {
              // This is a vine, and not the root of the vine. We previously forwarded a
              // three-party handoff to the peer, and the peer reflected it back to us. We need
              // to wrap this in a new `DeferredThirdPartyClient` so that if it is sent to yet
              // another party, it will be handed off correctly. If we just pass along the vine
              // itself, then three-party handoff will stop working.
              KJ_ASSERT(isSameNetwork(*result));
              kj::Own<RpcClient> vine = result.downcast<RpcClient>();
              auto& vineConnection = *vine->connectionState;
              result = kj::refcounted<DeferredThirdPartyClient>(
                  vineConnection, capnp::clone(*contact), kj::mv(vine));
            }
          }
          if (unwrapIfSameConnection(*result) != kj::none) {
            result = kj::refcounted<TribbleRaceBlocker>(kj::mv(result));
          }
          return kj::mv(result);
        } else {
          return newBrokenCap("invalid 'receiverHosted' export ID");
        }

      case rpc::CapDescriptor::RECEIVER_ANSWER: {
        auto promisedAnswer = descriptor.getReceiverAnswer();

        KJ_IF_SOME(answer, answers.find(promisedAnswer.getQuestionId())) {
          KJ_IF_SOME(pipeline, answer.pipeline) {
            auto ops = toPipelineOps(promisedAnswer.getTransform());
            auto result = pipeline->getPipelinedCap(ops);
            if (unwrapIfSameConnection(*result) != kj::none) {
              result = kj::refcounted<TribbleRaceBlocker>(kj::mv(result));
            }
            return kj::mv(result);
          }
        }

        return newBrokenCap("invalid 'receiverAnswer'");
      }

      case rpc::CapDescriptor::THIRD_PARTY_HOSTED: {
        // We need to connect to a third party to accept this capability.

        auto tph = descriptor.getThirdPartyHosted();

        // Import the vine first so that we're sure to drop it if anything goes wrong.
        auto vine = import(tph.getVineId(), false, kj::mv(fd));

        return kj::refcounted<DeferredThirdPartyClient>(
            *this, capnp::clone(tph.getId()), kj::mv(vine));
      }

      default:
        KJ_FAIL_REQUIRE("unknown CapDescriptor type");
        return newBrokenCap("unknown CapDescriptor type");
    }